

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void generateColumnNames(Parse *pParse,Select *pSelect)

{
  Vdbe *p_00;
  sqlite3 *db_00;
  SrcList *pTabList_00;
  sqlite3 *pEList_00;
  ulong uVar1;
  Expr *pEVar2;
  Table *pTVar3;
  char *zName_00;
  bool bVar4;
  char *local_90;
  char *z;
  char *zName_1;
  char *pcStack_68;
  int iCol;
  char *zCol;
  char *zName;
  Expr *p;
  int srcName;
  int fullName;
  sqlite3 *db;
  ExprList *pEList;
  SrcList *pTabList;
  Table *pTab;
  int i;
  Vdbe *v;
  Select *pSelect_local;
  Parse *pParse_local;
  
  p_00 = pParse->pVdbe;
  db_00 = pParse->db;
  if ((pParse->explain == '\0') && (v = (Vdbe *)pSelect, pParse->colNamesSet == '\0')) {
    for (; v->nFkConstraint != 0; v = (Vdbe *)v->nFkConstraint) {
    }
    pTabList_00 = *(SrcList **)&v->nMem;
    pEList_00 = v->db;
    pParse->colNamesSet = '\x01';
    bVar4 = (db_00->flags & 4) == 0;
    uVar1 = db_00->flags;
    sqlite3VdbeSetNumCols(p_00,*(int *)&pEList_00->pVfs);
    for (pTab._4_4_ = 0; pTab._4_4_ < *(int *)&pEList_00->pVfs; pTab._4_4_ = pTab._4_4_ + 1) {
      pEVar2 = ((ExprList_item *)&pEList_00->pVdbe)[pTab._4_4_].pExpr;
      if (*(long *)(pEList_00->aLimit + (long)pTab._4_4_ * 8 + -0x1b) == 0) {
        if (((uVar1 & 0x40) == 0 && bVar4) || (pEVar2->op != 0xa2)) {
          if (*(char **)(pEList_00->aLimit + (long)pTab._4_4_ * 8 + -0x19) == (char *)0x0) {
            local_90 = sqlite3MPrintf(db_00,"column%d",(ulong)(pTab._4_4_ + 1));
          }
          else {
            local_90 = sqlite3DbStrDup(db_00,*(char **)(pEList_00->aLimit +
                                                       (long)pTab._4_4_ * 8 + -0x19));
          }
          sqlite3VdbeSetColName(p_00,pTab._4_4_,0,local_90,sqlite3MallocSize);
        }
        else {
          zName_1._4_4_ = (int)pEVar2->iColumn;
          pTVar3 = (pEVar2->y).pTab;
          if (zName_1._4_4_ < 0) {
            zName_1._4_4_ = (int)pTVar3->iPKey;
          }
          if (zName_1._4_4_ < 0) {
            pcStack_68 = "rowid";
          }
          else {
            pcStack_68 = pTVar3->aCol[zName_1._4_4_].zName;
          }
          if (bVar4) {
            sqlite3VdbeSetColName
                      (p_00,pTab._4_4_,0,pcStack_68,(_func_void_void_ptr *)0xffffffffffffffff);
          }
          else {
            zName_00 = sqlite3MPrintf(db_00,"%s.%s",pTVar3->zName,pcStack_68);
            sqlite3VdbeSetColName(p_00,pTab._4_4_,0,zName_00,sqlite3MallocSize);
          }
        }
      }
      else {
        sqlite3VdbeSetColName
                  (p_00,pTab._4_4_,0,*(char **)(pEList_00->aLimit + (long)pTab._4_4_ * 8 + -0x1b),
                   (_func_void_void_ptr *)0xffffffffffffffff);
      }
    }
    generateColumnTypes(pParse,pTabList_00,(ExprList *)pEList_00);
  }
  return;
}

Assistant:

static void generateColumnNames(
  Parse *pParse,      /* Parser context */
  Select *pSelect     /* Generate column names for this SELECT statement */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  Table *pTab;
  SrcList *pTabList;
  ExprList *pEList;
  sqlite3 *db = pParse->db;
  int fullName;    /* TABLE.COLUMN if no AS clause and is a direct table ref */
  int srcName;     /* COLUMN or TABLE.COLUMN if no AS clause and is direct */

#ifndef SQLITE_OMIT_EXPLAIN
  /* If this is an EXPLAIN, skip this step */
  if( pParse->explain ){
    return;
  }
#endif

  if( pParse->colNamesSet ) return;
  /* Column names are determined by the left-most term of a compound select */
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  SELECTTRACE(1,pParse,pSelect,("generating column names\n"));
  pTabList = pSelect->pSrc;
  pEList = pSelect->pEList;
  assert( v!=0 );
  assert( pTabList!=0 );
  pParse->colNamesSet = 1;
  fullName = (db->flags & SQLITE_FullColNames)!=0;
  srcName = (db->flags & SQLITE_ShortColNames)!=0 || fullName;
  sqlite3VdbeSetNumCols(v, pEList->nExpr);
  for(i=0; i<pEList->nExpr; i++){
    Expr *p = pEList->a[i].pExpr;

    assert( p!=0 );
    assert( p->op!=TK_AGG_COLUMN );  /* Agg processing has not run yet */
    assert( p->op!=TK_COLUMN || p->y.pTab!=0 ); /* Covering idx not yet coded */
    if( pEList->a[i].zName ){
      /* An AS clause always takes first priority */
      char *zName = pEList->a[i].zName;
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_TRANSIENT);
    }else if( srcName && p->op==TK_COLUMN ){
      char *zCol;
      int iCol = p->iColumn;
      pTab = p->y.pTab;
      assert( pTab!=0 );
      if( iCol<0 ) iCol = pTab->iPKey;
      assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
      if( iCol<0 ){
        zCol = "rowid";
      }else{
        zCol = pTab->aCol[iCol].zName;
      }
      if( fullName ){
        char *zName = 0;
        zName = sqlite3MPrintf(db, "%s.%s", pTab->zName, zCol);
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_DYNAMIC);
      }else{
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zCol, SQLITE_TRANSIENT);
      }
    }else{
      const char *z = pEList->a[i].zSpan;
      z = z==0 ? sqlite3MPrintf(db, "column%d", i+1) : sqlite3DbStrDup(db, z);
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, z, SQLITE_DYNAMIC);
    }
  }
  generateColumnTypes(pParse, pTabList, pEList);
}